

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O0

void __thiscall
ResultToJUnitHandler::testCaseResultComplete
          (ResultToJUnitHandler *this,TestCaseResultPtr *resultData)

{
  TestCaseResultData *data;
  Writer *pWVar1;
  char *value_;
  Attribute local_1d0;
  BeginElement local_190;
  Attribute local_170;
  Attribute local_130;
  BeginElement local_f0;
  undefined1 local_d0 [8];
  string groupName;
  string caseName;
  size_t sepPos;
  undefined1 local_78 [8];
  TestCaseResult result;
  TestCaseResultPtr *resultData_local;
  ResultToJUnitHandler *this_local;
  
  result.resultItems.m_items.super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultData;
  xe::TestCaseResult::TestCaseResult((TestCaseResult *)local_78);
  data = de::SharedPtr<xe::TestCaseResultData>::get
                   ((SharedPtr<xe::TestCaseResultData> *)
                    result.resultItems.m_items.
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  xe::parseTestCaseResultFromData(&this->m_resultParser,(TestCaseResult *)local_78,data);
  std::__cxx11::string::find_last_of((char)local_78,0x2e);
  std::__cxx11::string::substr((ulong)((long)&groupName.field_2 + 8),(ulong)local_78);
  std::__cxx11::string::substr((ulong)local_d0,(ulong)local_78);
  pWVar1 = this->m_writer;
  xe::xml::Writer::BeginElement::BeginElement(&local_f0,"testcase");
  pWVar1 = xe::xml::Writer::operator<<(pWVar1,&local_f0);
  xe::xml::Writer::Attribute::Attribute(&local_130,"name",(string *)((long)&groupName.field_2 + 8));
  pWVar1 = xe::xml::Writer::operator<<(pWVar1,&local_130);
  xe::xml::Writer::Attribute::Attribute(&local_170,"classname",(string *)local_d0);
  xe::xml::Writer::operator<<(pWVar1,&local_170);
  xe::xml::Writer::Attribute::~Attribute(&local_170);
  xe::xml::Writer::Attribute::~Attribute(&local_130);
  xe::xml::Writer::BeginElement::~BeginElement(&local_f0);
  if (result.super_TestCaseResultHeader.casePath.field_2._12_4_ != 0) {
    pWVar1 = this->m_writer;
    xe::xml::Writer::BeginElement::BeginElement(&local_190,"failure");
    pWVar1 = xe::xml::Writer::operator<<(pWVar1,&local_190);
    value_ = xe::getTestStatusCodeName(result.super_TestCaseResultHeader.casePath.field_2._12_4_);
    xe::xml::Writer::Attribute::Attribute(&local_1d0,"type",value_);
    pWVar1 = xe::xml::Writer::operator<<(pWVar1,&local_1d0);
    pWVar1 = xe::xml::Writer::operator<<
                       (pWVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &result.super_TestCaseResultHeader.caseType);
    xe::xml::Writer::operator<<(pWVar1,(EndElementType *)&xe::xml::Writer::EndElement);
    xe::xml::Writer::Attribute::~Attribute(&local_1d0);
    xe::xml::Writer::BeginElement::~BeginElement(&local_190);
  }
  xe::xml::Writer::operator<<(this->m_writer,(EndElementType *)&xe::xml::Writer::EndElement);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(groupName.field_2._M_local_buf + 8));
  xe::TestCaseResult::~TestCaseResult((TestCaseResult *)local_78);
  return;
}

Assistant:

void testCaseResultComplete (const xe::TestCaseResultPtr& resultData)
	{
		using xe::xml::Writer;

		xe::TestCaseResult result;

		xe::parseTestCaseResultFromData(&m_resultParser, &result, *resultData.get());

		// Split group and case names.
		size_t			sepPos		= result.casePath.find_last_of('.');
		std::string		caseName	= result.casePath.substr(sepPos+1);
		std::string		groupName	= result.casePath.substr(0, sepPos);

		// Write result.
		m_writer << Writer::BeginElement("testcase")
				 << Writer::Attribute("name", caseName)
				 << Writer::Attribute("classname", groupName);

		if (result.statusCode != xe::TESTSTATUSCODE_PASS)
			m_writer << Writer::BeginElement("failure")
					 << Writer::Attribute("type", xe::getTestStatusCodeName(result.statusCode))
					 << result.statusDetails
					 << Writer::EndElement;

		m_writer << Writer::EndElement;
	}